

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a3d2::ARTKeyEncodeDecodeTest_FloatC0001_Test::
~ARTKeyEncodeDecodeTest_FloatC0001_Test(ARTKeyEncodeDecodeTest_FloatC0001_Test *this)

{
  ARTKeyEncodeDecodeTest_FloatC0001_Test *this_local;
  
  ~ARTKeyEncodeDecodeTest_FloatC0001_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, FloatC0001) {
  using F = float;
  constexpr auto pzero = 0.F;
  constexpr auto nzero = -0.F;
  UNODB_EXPECT_FALSE(std::signbit(pzero));
  UNODB_EXPECT_TRUE(std::signbit(nzero));
  do_encode_decode_float_test(pzero);
  do_encode_decode_float_test(nzero);
  do_encode_decode_float_test(10.001F);
  do_encode_decode_float_test(-10.001F);
  do_encode_decode_float_test(std::numeric_limits<F>::min());
  do_encode_decode_float_test(std::numeric_limits<F>::lowest());
  do_encode_decode_float_test(std::numeric_limits<F>::max());
  do_encode_decode_float_test(std::numeric_limits<F>::epsilon());
  do_encode_decode_float_test(std::numeric_limits<F>::denorm_min());
}